

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O3

void __thiscall FOTerm::print(FOTerm *this,ostream *o)

{
  ostream *poVar1;
  ulong uVar2;
  size_type sVar3;
  char *pcVar4;
  pointer pFVar5;
  long lVar6;
  ulong uVar7;
  
  if (this->tag == Functor) {
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (o,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(",1);
    pFVar5 = (this->params).super__Vector_base<FOTerm,_std::allocator<FOTerm>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->params).super__Vector_base<FOTerm,_std::allocator<FOTerm>_>._M_impl.
        super__Vector_impl_data._M_finish != pFVar5) {
      lVar6 = 0;
      uVar7 = 0;
      do {
        print((FOTerm *)
              ((long)&(pFVar5->params).super__Vector_base<FOTerm,_std::allocator<FOTerm>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar6),o);
        uVar7 = uVar7 + 1;
        pFVar5 = (this->params).super__Vector_base<FOTerm,_std::allocator<FOTerm>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar2 = (long)(this->params).super__Vector_base<FOTerm,_std::allocator<FOTerm>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pFVar5 >> 6;
        if (uVar7 < uVar2) {
          std::__ostream_insert<char,std::char_traits<char>>(o,", ",2);
          pFVar5 = (this->params).super__Vector_base<FOTerm,_std::allocator<FOTerm>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar2 = (long)(this->params).super__Vector_base<FOTerm,_std::allocator<FOTerm>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pFVar5 >> 6;
        }
        lVar6 = lVar6 + 0x40;
      } while (uVar7 < uVar2);
    }
    pcVar4 = ")";
    sVar3 = 1;
  }
  else {
    if (this->tag != Variable) {
      return;
    }
    pcVar4 = (this->name)._M_dataplus._M_p;
    sVar3 = (this->name)._M_string_length;
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,pcVar4,sVar3);
  return;
}

Assistant:

void print(std::ostream &o) {
        switch (tag) {
            case FOTermTag::Variable:
                o << name;
                return;
            case FOTermTag::Functor:
                o << name << "(";
                for (int i = 0; i < params.size(); ++i) {
                    params[i].print(o);
                    if (i + 1 < params.size()) o << ", ";
                }
                o << ")";
        }
    }